

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

uint32_t * createDFDAlpha(int bigEndian,int bytes,VkSuffix suffix)

{
  uint32_t *puVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  uint32_t *unaff_retaddr;
  int in_stack_00000010;
  int channelByte;
  int channel;
  uint32_t *DFD;
  channels_infotype in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  int in_stack_fffffffffffffff0;
  
  if (in_EDI == 0) {
    puVar1 = writeHeader(3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd8);
    writeSample(unaff_retaddr,in_EDI,in_ESI,in_EDX,in_stack_fffffffffffffff0,
                (int)((ulong)puVar1 >> 0x20),in_stack_00000010,channelByte);
  }
  else {
    puVar1 = writeHeader(3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd8);
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      writeSample(unaff_retaddr,in_EDI,in_ESI,in_EDX,in_stack_fffffffffffffff0,
                  (int)((ulong)puVar1 >> 0x20),in_stack_00000010,channelByte);
    }
  }
  return puVar1;
}

Assistant:

uint32_t *createDFDAlpha(int bigEndian, int bytes,
                         enum VkSuffix suffix) {
    uint32_t *DFD;
    int channel = 3; /* alpha channel */
    if (bigEndian) {
        int channelByte;
        /* Number of samples = number of channels * bytes per channel */
        DFD = writeHeader(bytes, bytes, suffix, i_COLOR);
        /* Loop over the bytes that constitute a channel */
        for (channelByte = 0; channelByte < bytes; ++channelByte) {
            writeSample(DFD, channelByte, channel,
                        8, 8 * (bytes - channelByte - 1),
                        channelByte == bytes-1, channelByte == 0, suffix);
        }
    } else { /* Little-endian */
        /* One sample per channel */
        DFD = writeHeader(1, bytes, suffix, i_COLOR);
        writeSample(DFD, 0, channel,
                    8 * bytes, 0,
                    1, 1, suffix);
    }
    return DFD;
}